

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O2

void pputrast(char *fn,uchar *hd,float *bf,int sx,int sy,int r)

{
  int iVar1;
  ssize_t sVar2;
  ulong uVar3;
  ulong uVar4;
  uchar c;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  iVar1 = creat(fn,0x180);
  if (iVar1 < 1) {
    iVar1 = 9;
  }
  else {
    sVar2 = write(iVar1,hd,0x20);
    if (sVar2 == 0x20) {
      if (sx < 1) {
        sx = 0;
      }
      local_40 = (ulong)(uint)sy;
      if (sy < 1) {
        local_40 = 0;
      }
      uVar3 = 0;
      local_48 = (long)r << 2;
      do {
        if (uVar3 == local_40) {
          close(iVar1);
          return;
        }
        uVar4 = 0;
        local_38 = uVar3;
        while ((uint)sx != uVar4) {
          c = (uchar)(int)bf[uVar4];
          sVar2 = write(iVar1,&c,1);
          uVar4 = uVar4 + 1;
          if (sVar2 != 1) {
            iVar1 = 7;
            goto LAB_0010298b;
          }
        }
        uVar3 = local_38 + 1;
        bf = (float *)((long)bf + local_48);
      } while( true );
    }
    iVar1 = 8;
  }
LAB_0010298b:
  error(iVar1);
}

Assistant:

void pputrast(fn,hd,bf,sx,sy,r)
char *fn ;
unsigned char hd[H] ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = creat(fn,0600)) > 0) { ;
    if (write(fd,hd,H) == H) {
      for (i = 0 ; i < sy ; i++) {
        for (j = 0 ; j < sx ; j++) {
          c = (unsigned char)bf[r*i + j] ;
          if (write(fd,&c,sizeof(c)) != 1) {
            error(7) ;
          }
        }
      }
    }
    else {
      error(8) ;
    }
  }
  else {
    error(9) ;
  }
  close(fd) ;
}